

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.cpp
# Opt level: O0

void __thiscall
cfd::core::logger::CfdLogger::WriteLog
          (CfdLogger *this,CfdSourceLocation *location,CfdLogLevel level,string *log_message)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  string *log_message_local;
  CfdLogLevel level_local;
  CfdSourceLocation *location_local;
  CfdLogger *this_local;
  
  if (((((this->is_initialized_ & 1U) != 0) && ((this->is_alive_ & 1U) != 0)) &&
      (this->function_address_ == (void *)0x0)) && (this->default_logger_ != (void *)0x0)) {
    pcVar2 = location->filename;
    uVar1 = location->line;
    pcVar3 = location->funcname;
    uVar4 = ::std::__cxx11::string::c_str();
    printf("[%s:%d](%d) %s: %s",pcVar2,(ulong)uVar1,(ulong)level,pcVar3,uVar4);
  }
  return;
}

Assistant:

void cfd::core::logger::CfdLogger::WriteLog(
    const CfdSourceLocation& location, cfd::core::logger::CfdLogLevel level,
    const std::string& log_message) {
  if (is_initialized_ && is_alive_) {
    if (function_address_ != nullptr) {
      // extend log
    } else if (default_logger_ != nullptr) {
#if defined(CFDCORE_LOGGING) && (defined(DEBUG) || defined(CFDCORE_DEBUG))
      auto logger = static_cast<quill::Logger*>(default_logger_);
      if (level == CfdLogLevel::kCfdLogLevelCritical) {
        LOG_CRITICAL(
            logger, "[{}:{}] {}", location.filename, location.line,
            log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelError) {
        LOG_ERROR(
            logger, "[{}:{}] {}", location.filename, location.line,
            log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelWarning) {
        LOG_WARNING(
            logger, "[{}:{}] {}", location.filename, location.line,
            log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelInfo) {
        LOG_INFO(
            logger, "[{}:{}] {}: {}", location.filename, location.line,
            location.funcname, log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelDebug) {
        LOG_DEBUG(
            logger, "[{}:{}] {}: {}", location.filename, location.line,
            location.funcname, log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelTrace) {
        LOG_TRACE_L1(
            logger, "[{}:{}] {}: {}", location.filename, location.line,
            location.funcname, log_message);
      }
#else
      printf(
          "[%s:%d](%d) %s: %s", location.filename, location.line, level,
          location.funcname, log_message.c_str());
#endif  // CFDCORE_LOGGING
    }
  }
}